

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_get_attribute_by_name
          (exr_const_context_t ctxt,int part_index,char *name,exr_attribute_t **outattr)

{
  undefined8 *in_RCX;
  exr_attribute_t **in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *tmpptr;
  undefined8 local_30;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *list;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar1 = 2;
  }
  else {
    list = in_RDI;
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      eVar1 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if (in_RCX == (undefined8 *)0x0) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      eVar1 = (*in_RDI->standard_error)(in_RDI,3);
    }
    else {
      eVar1 = exr_attr_list_find_by_name
                        ((exr_const_context_t)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (exr_attribute_list_t *)list,
                         (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
      if (eVar1 == 0) {
        *in_RCX = local_30;
      }
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_get_attribute_by_name (
    exr_const_context_t     ctxt,
    int                     part_index,
    const char*             name,
    const exr_attribute_t** outattr)
{
    exr_attribute_t* tmpptr;
    exr_result_t     rv;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!outattr)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    rv = exr_attr_list_find_by_name (
        EXR_CONST_CAST (exr_context_t, ctxt),
        EXR_CONST_CAST (exr_attribute_list_t*, &(part->attributes)),
        name,
        &tmpptr);
    if (rv == EXR_ERR_SUCCESS) *outattr = tmpptr;
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}